

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void skiwi::print_last_global_variable_used
               (ostream *out,shared_ptr<skiwi::environment<skiwi::environment_entry>_> *env,
               repl_data *rd,context *p_ctxt)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  bool bVar10;
  string varname;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>
  res;
  uint64_t ind;
  stringstream ss;
  string local_270;
  repl_data *local_250;
  _Rb_tree_node_base *local_248;
  ostream *local_240;
  shared_ptr<skiwi::environment<skiwi::environment_entry>_> *local_238;
  long local_230;
  string local_228;
  undefined8 local_208;
  _Base_ptr p_Stack_200;
  _Base_ptr local_1f8;
  _Base_ptr p_Stack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  context *local_1c8;
  element_type *local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined8 local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  _Base_ptr p_Stack_180;
  ios_base local_138 [264];
  
  if ((p_ctxt != (context *)0x0) &&
     ((env->
      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0)) {
    local_250 = rd;
    local_238 = env;
    local_1c8 = p_ctxt;
    std::__ostream_insert<char,std::char_traits<char>>(out,"\ncall stack:\n",0xd);
    local_248 = &(local_250->quote_to_index)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_230 = 4;
    local_240 = out;
    do {
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      p_Var2 = (_Base_ptr)local_1c8->last_global_variable_used[local_230];
      local_228._M_string_length = 0;
      local_228.field_2._M_local_buf[0] = '\0';
      local_1c0 = (local_238->
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      p_Var1 = &(local_1c0->env)._M_t._M_impl.super__Rb_tree_header;
      for (p_Var5 = *(_Base_ptr *)
                     ((long)&(local_1c0->env)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
          (_Rb_tree_header *)p_Var5 != p_Var1;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        local_1b8[0] = local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,*(long *)(p_Var5 + 1),
                   (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
        local_198 = *(undefined8 *)(p_Var5 + 2);
        p_Var3 = p_Var5[2]._M_parent;
        local_188 = p_Var5[2]._M_left;
        p_Stack_180 = p_Var5[2]._M_right;
        p_Stack_190 = p_Var3;
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if (p_Var3 == p_Var2) break;
      }
      if ((_Rb_tree_header *)p_Var5 == p_Var1) {
        local_270._M_dataplus._M_p =
             (pointer)(local_1c0->p_outer).
                      super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        local_270._M_string_length =
             (size_type)
             (local_1c0->p_outer).
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_270._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_270._M_string_length)->_M_use_count + 1;
          }
        }
        bVar10 = (element_type *)local_270._M_dataplus._M_p != (element_type *)0x0;
        if (bVar10) {
          bVar10 = true;
          do {
            p_Var8 = (_Rb_tree_node_base *)(local_270._M_dataplus._M_p + 8);
            for (p_Var5 = *(_Rb_tree_node_base **)(local_270._M_dataplus._M_p + 0x18);
                p_Var5 != p_Var8; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
              local_1b8[0] = local_1a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1b8,*(long *)(p_Var5 + 1),
                         (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
              local_198 = *(undefined8 *)(p_Var5 + 2);
              p_Var3 = p_Var5[2]._M_parent;
              local_188 = p_Var5[2]._M_left;
              p_Stack_180 = p_Var5[2]._M_right;
              p_Stack_190 = p_Var3;
              if (local_1b8[0] != local_1a8) {
                operator_delete(local_1b8[0],local_1a8[0] + 1);
              }
              if (p_Var3 == p_Var2) break;
            }
            if (p_Var5 != (_Rb_tree_node_base *)(local_270._M_dataplus._M_p + 8)) {
              std::__cxx11::string::_M_assign((string *)&local_228);
              local_208 = *(undefined8 *)(p_Var5 + 2);
              p_Stack_200 = p_Var5[2]._M_parent;
              local_1f8 = p_Var5[2]._M_left;
              p_Stack_1f0 = p_Var5[2]._M_right;
              break;
            }
            __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_270._M_dataplus._M_p + 0x38);
            local_270._M_dataplus._M_p =
                 (pointer)(((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)
                           (local_270._M_dataplus._M_p + 0x30))->
                          super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_270._M_string_length,__r
                      );
            bVar10 = (element_type *)local_270._M_dataplus._M_p != (element_type *)0x0;
          } while (bVar10);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._M_string_length);
        }
        lVar9 = local_230;
        if (bVar10) goto LAB_00249717;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_228);
        local_208 = *(undefined8 *)(p_Var5 + 2);
        p_Stack_200 = p_Var5[2]._M_parent;
        local_1f8 = p_Var5[2]._M_left;
        p_Stack_1f0 = p_Var5[2]._M_right;
LAB_00249717:
        lVar9 = local_230;
        poVar7 = local_240;
        p_Var5 = local_248;
        *(undefined8 *)(local_240 + *(long *)(*(long *)local_240 + -0x18) + 0x10) = 4;
        poVar6 = (ostream *)std::ostream::operator<<(local_240,(int)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        get_variable_name_before_alpha(&local_270,&local_228);
        std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_270);
        iVar4 = std::__cxx11::string::compare((char *)local_1b8);
        if (local_1b8[0] != local_1a8) {
          operator_delete(local_1b8[0],local_1a8[0] + 1);
        }
        if (iVar4 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__cxx11::string::substr((ulong)&local_1e8,(ulong)&local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
          if (local_1e8 != local_1d8) {
            operator_delete(local_1e8,local_1d8[0] + 1);
          }
          std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
          for (p_Var8 = (local_250->quote_to_index)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left; p_Var8 != p_Var5;
              p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
            if (*(long **)(p_Var8 + 2) == local_1e8) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(quote ",7);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
            }
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        else {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,
                        CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                 local_228.field_2._M_local_buf[0]) + 1);
      }
      local_230 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return;
}

Assistant:

void print_last_global_variable_used(std::ostream& out, std::shared_ptr<SKIWI::environment<SKIWI::environment_entry>> env, const repl_data& rd, const context* p_ctxt)
  {
  if (!p_ctxt)
    return;
  if (!env.get())
    return;

  out << "\ncall stack:\n";
  for (int stack_item = SKIWI_VARIABLE_DEBUG_STACK_SIZE - 1; stack_item >= 0; --stack_item)
    {
    uint64_t pos = p_ctxt->last_global_variable_used[stack_item];
    std::pair<std::string, SKIWI::environment_entry> res;
    if (env->find_if(res, [&](const std::pair<std::string, SKIWI::environment_entry>& v) { return v.second.pos == pos; }))
      {
      out << std::setw(4) << stack_item << ": ";
      std::string varname = get_variable_name_before_alpha(res.first);
      if (varname.substr(0, 3) == "#%q")
        {
        std::stringstream ss;
        ss << varname.substr(3);
        uint64_t ind;
        ss >> ind;
        for (const auto& q : rd.quote_to_index)
          {
          if (q.second == ind)
            {
            out << "(quote " << q.first << ")\n";
            }
          }
        }
      else
        out << varname << "\n";
      }
    }
  }